

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

int png_image_read_composite(png_voidp argument)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  png_const_structrp png_ptr;
  long lVar5;
  png_bytep row;
  uint uVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  byte *pbVar20;
  ulong local_80;
  uint local_70;
  uint local_6c;
  
  puVar4 = *argument;
  png_ptr = *(png_const_structrp *)*puVar4;
  local_70 = 1;
  if (png_ptr->interlaced != '\0') {
    if (png_ptr->interlaced != '\x01') {
      png_error(png_ptr,"unknown interlace type");
    }
    local_70 = 7;
  }
  iVar1 = *(int *)((long)puVar4 + 0xc);
  uVar2 = *(uint *)(puVar4 + 2);
  lVar5 = *(long *)((long)argument + 0x38);
  uVar3 = *(uint *)((long)puVar4 + 0x14);
  uVar19 = uVar3 & 2;
  uVar6 = uVar19 + 1;
  uVar7 = uVar6 * iVar1;
  uVar17 = 0;
  do {
    uVar14 = (uint)uVar17;
    if (png_ptr->interlaced == '\x01') {
      bVar13 = (byte)(7 - uVar14 >> 1);
      bVar10 = 3;
      if (1 < uVar14) {
        bVar10 = bVar13;
      }
      uVar15 = (uVar14 & 1) << (3U - (char)(uVar14 + 1 >> 1) & 0x1f) & 7;
      if ((~(-1 << (bVar10 & 0x1f)) + iVar1) - uVar15 >> (bVar10 & 0x1f) != 0) {
        uVar11 = uVar6 << (bVar13 & 0x1f);
        local_80 = (ulong)(uVar15 * uVar6);
        local_6c = 8 >> ((byte)(uVar14 - 1 >> 1) & 0x1f);
        uVar15 = (uVar14 & 1 ^ 1) << (3U - (char)(uVar17 >> 1) & 0x1f) & 7;
        if (uVar14 < 3) {
          local_6c = 8;
        }
        goto LAB_002c3bf9;
      }
    }
    else {
      local_6c = 1;
      local_80 = 0;
      uVar15 = 0;
      uVar11 = uVar6;
LAB_002c3bf9:
      for (; uVar15 < uVar2; uVar15 = uVar15 + local_6c) {
        row = *(png_bytep *)((long)argument + 0x28);
        png_read_row(png_ptr,row,(png_bytep)0x0);
        if ((uint)local_80 < uVar7) {
          lVar8 = (ulong)uVar15 * lVar5 + *(long *)((long)argument + 0x30);
          pbVar9 = (byte *)(lVar8 + local_80);
          pbVar20 = row + 1;
          do {
            bVar10 = pbVar20[(ulong)(uVar3 >> 1 & 1) * 2];
            if (bVar10 != 0) {
              bVar13 = pbVar20[-1];
              uVar12 = (uint)(byte)~bVar10;
              if (bVar10 != 0xff) {
                uVar18 = png_sRGB_table[*pbVar9] * uVar12 + (uint)bVar13 * 0xffff;
                uVar16 = uVar18 >> 0xf;
                bVar13 = (byte)(((uint)png_sRGB_delta[uVar16] * (uVar18 & 0x7fff) >> 0xc) +
                                (uint)png_sRGB_base[uVar16] >> 8);
              }
              *pbVar9 = bVar13;
              if (uVar19 != 0) {
                bVar13 = *pbVar20;
                if (bVar10 != 0xff) {
                  uVar18 = png_sRGB_table[pbVar9[1]] * uVar12 + (uint)bVar13 * 0xffff;
                  uVar16 = uVar18 >> 0xf;
                  bVar13 = (byte)(((uint)png_sRGB_delta[uVar16] * (uVar18 & 0x7fff) >> 0xc) +
                                  (uint)png_sRGB_base[uVar16] >> 8);
                }
                pbVar9[1] = bVar13;
                bVar13 = pbVar20[1];
                if (bVar10 != 0xff) {
                  uVar16 = png_sRGB_table[pbVar9[2]] * uVar12 + (uint)bVar13 * 0xffff;
                  uVar12 = uVar16 >> 0xf;
                  bVar13 = (byte)(((uint)png_sRGB_delta[uVar12] * (uVar16 & 0x7fff) >> 0xc) +
                                  (uint)png_sRGB_base[uVar12] >> 8);
                }
                pbVar9[2] = bVar13;
              }
            }
            pbVar9 = pbVar9 + uVar11;
            pbVar20 = pbVar20 + (ulong)uVar19 + 2;
          } while (pbVar9 < (byte *)((ulong)uVar7 + lVar8));
        }
      }
    }
    uVar17 = (ulong)(uVar14 + 1);
    if (uVar14 + 1 == local_70) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
png_image_read_composite(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      ptrdiff_t    step_row = display->row_bytes;
      unsigned int channels =
          (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ? 3 : 1;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass) * channels;
            stepx = PNG_PASS_COL_OFFSET(pass) * channels;
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = channels;
            stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow;
            png_const_bytep end_row;

            /* Read the row, which is packed: */
            png_read_row(png_ptr, inrow, NULL);

            outrow = png_voidcast(png_bytep, display->first_row);
            outrow += y * step_row;
            end_row = outrow + width * channels;

            /* Now do the composition on each pixel in this row. */
            outrow += startx;
            for (; outrow < end_row; outrow += stepx)
            {
               png_byte alpha = inrow[channels];

               if (alpha > 0) /* else no change to the output */
               {
                  unsigned int c;

                  for (c=0; c<channels; ++c)
                  {
                     png_uint_32 component = inrow[c];

                     if (alpha < 255) /* else just use component */
                     {
                        /* This is PNG_OPTIMIZED_ALPHA, the component value
                         * is a linear 8-bit value.  Combine this with the
                         * current outrow[c] value which is sRGB encoded.
                         * Arithmetic here is 16-bits to preserve the output
                         * values correctly.
                         */
                        component *= 257*255; /* =65535 */
                        component += (255-alpha)*png_sRGB_table[outrow[c]];

                        /* So 'component' is scaled by 255*65535 and is
                         * therefore appropriate for the sRGB to linear
                         * conversion table.
                         */
                        component = PNG_sRGB_FROM_LINEAR(component);
                     }

                     outrow[c] = (png_byte)component;
                  }
               }

               inrow += channels+1; /* components and alpha channel */
            }
         }
      }
   }

   return 1;
}